

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
::iterator::operator*(iterator *this)

{
  code *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  size_t size;
  undefined1 auVar5 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  MixingHashState MVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  iterator iVar9;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
    ::iterator::operator*((iterator *)this);
LAB_0021b563:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
    goto LAB_0021b563;
    if (-1 < (char)*pcVar1) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
  ::iterator::operator*((iterator *)this);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->_M_dataplus
           )._M_p;
  if ((pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     (-1 < (char)*(code *)&(pbVar2->_M_dataplus)._M_p)) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (in_RSI->_M_dataplus)._M_p;
    if ((pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
         pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
       (-1 < (char)*(code *)&(pbVar3->_M_dataplus)._M_p)) {
      if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
          pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_0021b63d:
        return (reference)CONCAT71((int7)((ulong)pbVar2 >> 8),pbVar2 == pbVar3);
      }
      if ((pbVar2 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) !=
          (pbVar3 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>))
      goto LAB_0021b659;
      if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
          pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0021b63d;
      if ((pbVar3 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&kSooControl) ==
          (pbVar2 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&kSooControl)) {
        this = (iterator *)
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->
               _M_string_length;
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_RSI->_M_string_length;
        if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &kSooControl) {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this == pbVar4)
          goto LAB_0021b63d;
        }
        else {
          pbVar8 = pbVar4;
          pbVar6 = pbVar3;
          in_RSI = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
          if (pbVar3 < pbVar2) {
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
            pbVar6 = pbVar2;
            in_RSI = pbVar4;
          }
          if ((pbVar6 < in_RSI) && (in_RSI <= pbVar8)) goto LAB_0021b63d;
        }
      }
      container_internal::operator==();
      goto LAB_0021b64f;
    }
  }
  else {
LAB_0021b64f:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_0021b659:
  container_internal::operator==();
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
  ::AssertHashEqConsistent<std::__cxx11::string>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
              *)this,in_RSI);
  size = in_RSI->_M_string_length;
  MVar7 = hash_internal::MixingHashState::combine_contiguous
                    ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                     (uchar *)(in_RSI->_M_dataplus)._M_p,size);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = MVar7.state_ + size;
  iVar9 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
          ::find_non_soo<std::__cxx11::string>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
                      *)this,in_RSI,
                     SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0));
  return (reference)iVar9.ctrl_;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }